

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_173::PCVScanner::~PCVScanner(PCVScanner *this)

{
  PCVScanner *this_local;
  
  ~PCVScanner(this);
  operator_delete(this,0x148);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<PCVScanner>(
      functionNewInfos, functionSetGetInfos, functionCopyInfos);
  }